

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isWellFormedIPv4Address(XMLCh *addr,XMLSize_t length)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar3 = 0;
  iVar4 = 0;
  for (uVar5 = 0; iVar2 = iVar4, length != uVar5; uVar5 = uVar5 + 1) {
    if (addr[uVar5] == L'.') {
      if (((uVar5 == 0) || (length - 1 == uVar5)) ||
         (bVar1 = XMLString::isDigit(addr[uVar5 + 1]), !bVar1)) break;
      iVar2 = iVar4 + 1;
      iVar3 = 0;
      bVar1 = 2 < iVar4;
      iVar4 = iVar2;
      if (bVar1) break;
    }
    else {
      bVar1 = XMLString::isDigit(addr[uVar5]);
      if ((2 < iVar3) || (!bVar1)) break;
      iVar3 = iVar3 + 1;
      if (iVar3 == 3) {
        if (0x31 < (ushort)addr[uVar5 - 2]) {
          if (addr[uVar5 - 2] != L'2') break;
          if (0x34 < (ushort)addr[uVar5 - 1]) {
            if ((addr[uVar5 - 1] == L'5') && (iVar3 = 3, (ushort)addr[uVar5] < 0x36))
            goto LAB_0026ad8e;
            break;
          }
        }
        iVar3 = 3;
      }
    }
LAB_0026ad8e:
  }
  return iVar2 == 3 && length <= uVar5;
}

Assistant:

bool XMLUri::isWellFormedIPv4Address(const XMLCh* const addr, const XMLSize_t length)
{
    int numDots = 0;
    int numDigits = 0;

    // IPv4address = 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT "." 1*3DIGIT
    //
    // make sure that
    // 1) we see only digits and dot separators,
    // 2) that any dot separator is preceded and followed by a digit
    // 3) that we find 3 dots
    // 4) that each segment contains 1 to 3 digits.
    // 5) that each segment is not greater than 255.
    for (XMLSize_t i = 0; i < length; ++i)
    {
        if (addr[i] == chPeriod)
        {
            if ((i == 0) ||
                (i+1 == length) ||
                !XMLString::isDigit(addr[i+1]))
            {
               return false;
            }
            numDigits = 0;
            if (++numDots > 3)
                return false;
        }
        else if (!XMLString::isDigit(addr[i]))
        {
            return false;
        }
        // Check that that there are no more than three digits
        // in this segment.
        else if (++numDigits > 3)
        {
            return false;
        }
        // Check that this segment is not greater than 255.
        else if (numDigits == 3)
        {
            XMLCh first = addr[i-2];
            XMLCh second = addr[i-1];
            XMLCh last = addr[i];
            if (!(first < chDigit_2 ||
                 (first == chDigit_2 &&
                 (second < chDigit_5 ||
                 (second == chDigit_5 && last <= chDigit_5)))))
            {
                return false;
            }
        }
    } //for
    return (numDots == 3);
}